

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::CheckSignature(TypeChecker *this,TypeVector *sig,char *desc)

{
  pointer pTVar1;
  Result RVar2;
  int iVar3;
  ulong uVar4;
  Result result;
  size_t i;
  ulong uVar5;
  
  result.enum_ = Ok;
  iVar3 = -1;
  uVar5 = 0;
  while( true ) {
    pTVar1 = (sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pTVar1 >> 2;
    if (uVar4 <= uVar5) break;
    RVar2 = PeekAndCheckType(this,(int)uVar4 + iVar3,(Type)pTVar1[uVar5].enum_);
    result.enum_ = (Enum)(RVar2.enum_ == Error || result.enum_ != Ok);
    uVar5 = uVar5 + 1;
    iVar3 = iVar3 + -1;
  }
  PrintStackIfFailed(this,result,desc,sig);
  return (Result)result.enum_;
}

Assistant:

Result TypeChecker::CheckSignature(const TypeVector& sig, const char* desc) {
  Result result = Result::Ok;
  for (size_t i = 0; i < sig.size(); ++i) {
    result |= PeekAndCheckType(sig.size() - i - 1, sig[i]);
  }
  PrintStackIfFailed(result, desc, sig);
  return result;
}